

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

void pnga_summarize(Integer verbose)

{
  Integer IVar1;
  long in_RDI;
  Integer nproc;
  Integer hip [7];
  Integer lop [7];
  Integer in_stack_00000088;
  Integer dims [7];
  Integer ndim;
  char *name;
  Integer active;
  Integer type;
  Integer arr_no;
  Integer printed;
  Integer g_a;
  Integer j;
  Integer i;
  Integer *in_stack_000001f8;
  Integer *in_stack_00000200;
  Integer in_stack_00000208;
  Integer in_stack_00000210;
  undefined8 local_108 [8];
  undefined8 local_c8 [8];
  undefined8 local_88 [7];
  long local_50;
  undefined8 local_48;
  Integer local_40;
  undefined8 local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  long local_18;
  ulong local_10;
  long local_8;
  
  local_8 = in_RDI;
  IVar1 = pnga_nnodes();
  fprintf(_stdout," Summary of allocated global arrays\n");
  fprintf(_stdout,"-----------------------------------\n");
  local_28 = 0;
  local_30 = 0;
  for (local_20 = 0xfffffffffffffc18; (long)local_20 < -900; local_20 = local_20 + 1) {
    local_40 = pnga_verify_handle(local_20);
    if (local_40 == 1) {
      local_28 = 1;
      pnga_inquire(verbose,(Integer *)i,(Integer *)j,(Integer *)g_a);
      pnga_inquire_name(printed,(char **)arr_no);
      switch(local_38) {
      case 0x3e9:
        fprintf(_stdout,"  array %d => integer ",local_30 & 0xffffffff);
        break;
      case 0x3ea:
        fprintf(_stdout,"  array %d => long ",local_30 & 0xffffffff);
        break;
      case 0x3eb:
        fprintf(_stdout,"  array %d => float ",local_30 & 0xffffffff);
        break;
      case 0x3ec:
        fprintf(_stdout,"  array %d => double precision ",local_30 & 0xffffffff);
        break;
      default:
        pnga_error((char *)dims[0],in_stack_00000088);
        break;
      case 0x3ee:
        fprintf(_stdout,"  array %d => float (single) complex ",local_30 & 0xffffffff);
        break;
      case 0x3ef:
        fprintf(_stdout,"  array %d => double complex ",local_30 & 0xffffffff);
        break;
      case 0x3f8:
        fprintf(_stdout,"  array %d => long long",local_30 & 0xffffffff);
      }
      local_30 = local_30 + 1;
      fprintf(_stdout,"%s(",local_48);
      for (local_10 = 0; (long)local_10 < local_50; local_10 = local_10 + 1) {
        if (local_10 == local_50 - 1U) {
          fprintf(_stdout,"%ld",local_88[local_10]);
        }
        else {
          fprintf(_stdout,"%ld,",local_88[local_10]);
        }
      }
      fprintf(_stdout,"),  handle: %d \n",local_20 & 0xffffffff);
      if (local_8 != 0) {
        for (local_10 = 0; (long)local_10 < IVar1; local_10 = local_10 + 1) {
          pnga_distribution(in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8)
          ;
          fprintf(_stdout,"    (");
          for (local_18 = 0; local_18 < local_50; local_18 = local_18 + 1) {
            if (local_18 == local_50 + -1) {
              fprintf(_stdout,"%ld:%ld",local_c8[local_18],local_108[local_18]);
            }
            else {
              fprintf(_stdout,"%ld:%ld,",local_c8[local_18],local_108[local_18]);
            }
          }
          fprintf(_stdout,") -> %d \n",local_10 & 0xffffffff);
        }
      }
    }
  }
  if (local_28 == 0) {
    fprintf(_stdout,"  No active global arrays\n");
  }
  fprintf(_stdout,"\n\n");
  fflush(_stdout);
  return;
}

Assistant:

void pnga_summarize(Integer verbose)
{
#define DEV stdout
    
    Integer i, j, g_a;
    Integer printed, arr_no;
    Integer type, active;
    char *name;
    Integer ndim, dims[MAXDIM];
    Integer lop[MAXDIM], hip[MAXDIM];
    Integer nproc = pnga_nnodes();
    
    fprintf(DEV, " Summary of allocated global arrays\n");
    fprintf(DEV, "-----------------------------------\n");

    printed = 0;
    arr_no = 0;
    
    for(g_a=-1000; g_a<-900; g_a++) {
        active = pnga_verify_handle(g_a);

        if(active == 1) {
            printed = 1;
            pnga_inquire(g_a, &type, &ndim, dims);
            pnga_inquire_name(g_a, &name);
            
            switch(type) {
                case C_INT:
                    fprintf(DEV, "  array %d => integer ", (int)arr_no);
                    break;
                case C_DBL:
                    fprintf(DEV, "  array %d => double precision ",(int)arr_no);
                    break;
                case C_DCPL:
                    fprintf(DEV, "  array %d => double complex ", (int)arr_no);
                    break;
                case C_SCPL:
                    fprintf(DEV, "  array %d => float (single) complex ", (int)arr_no);
                    break;
                case C_FLOAT:
                    fprintf(DEV, "  array %d => float ",(int)arr_no);
                    break;       
                case C_LONG:
                    fprintf(DEV, "  array %d => long ",(int)arr_no);
                    break;   
                case C_LONGLONG:
                    fprintf(DEV, "  array %d => long long",(int)arr_no);
                    break;   
                default: pnga_error("ga_print: wrong type",0);
            }
            arr_no++;

            fprintf(DEV,"%s(", name);
            for(i=0; i<ndim; i++)
                if(i != (ndim-1)) fprintf(DEV, "%ld,", (long)dims[i]);
                else fprintf(DEV, "%ld", (long)dims[i]);
            fprintf(DEV,"),  handle: %d \n",(int) g_a);

            if(verbose) {
                for(i=0; i<nproc; i++){
                    pnga_distribution(g_a, i, lop, hip);
                    
                    fprintf(DEV,"    (");
                    for(j=0; j<ndim; j++)
                        if(j != (ndim-1))
                            fprintf(DEV, "%ld:%ld,",(long)lop[j], (long)hip[j]);
                        else
                            fprintf(DEV, "%ld:%ld", (long)lop[j], (long)hip[j]);
                    fprintf(DEV,") -> %d \n",(int) i);
                }
            }
        }
    }

    if(!printed) fprintf(DEV, "  No active global arrays\n");

    fprintf(DEV, "\n\n");
    fflush(DEV);
}